

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipv6_address.c
# Opt level: O3

LY_ERR lyplg_type_store_ipv6_address
                 (ly_ctx *ctx,lysc_type *type,void *value,size_t value_len,uint32_t options,
                 LY_VALUE_FORMAT format,void *UNUSED_prefix_data,uint32_t hints,
                 lysc_node *UNUSED_ctx_node,lyd_value *storage,lys_glob_unres *UNUSED_unres,
                 ly_err_item **err)

{
  anon_union_24_16_e2776397_for_lyd_value_2 *__buf;
  char **str_p;
  lysc_range *range;
  undefined8 uVar1;
  LY_ERR LVar2;
  int iVar3;
  ushort **ppuVar4;
  size_t sVar5;
  lyd_value *str_p_00;
  char *__cp;
  char *pcVar6;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar7;
  char *local_50;
  
  uVar7 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  __buf = &storage->field_2;
  storage->_canonical = (char *)0x0;
  storage->realtype = (lysc_type *)0x0;
  (storage->field_2).dec64 = 0;
  *(undefined8 *)((long)&storage->field_2 + 8) = 0;
  *(undefined8 *)((long)&storage->field_2 + 0x10) = 0;
  storage->realtype = type;
  if (format == LY_VALUE_LYB) {
    if (value_len < 0x10) {
      pcVar6 = "Invalid LYB ipv6-address value size %zu (expected at least 16).";
LAB_001bd858:
      LVar2 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,pcVar6,value_len);
    }
    else {
      if (value_len == 0x10) {
        uVar1 = *(undefined8 *)((long)value + 8);
        __buf->dec64 = *value;
        *(undefined8 *)((long)&storage->field_2 + 8) = uVar1;
      }
      else {
        ppuVar4 = __ctype_b_loc();
        sVar5 = 0x10;
        do {
          if (((*ppuVar4)[*(char *)((long)value + sVar5)] & 8) == 0) {
            value_len = CONCAT44(uVar7,(int)*(char *)((long)value + sVar5));
            pcVar6 = "Invalid LYB ipv6-address zone character 0x%x.";
            goto LAB_001bd858;
          }
          sVar5 = sVar5 + 1;
        } while (value_len != sVar5);
        uVar1 = *(undefined8 *)((long)value + 8);
        __buf->dec64 = *value;
        *(undefined8 *)((long)&storage->field_2 + 8) = uVar1;
        if (value_len != 0x10) {
          value_len = value_len - 0x10;
          str_p_00 = (lyd_value *)((long)&storage->field_2 + 0x10);
          pcVar6 = (char *)((long)value + 0x10);
          goto LAB_001bd996;
        }
      }
      *(undefined8 *)((long)&storage->field_2 + 0x10) = 0;
      LVar2 = LY_SUCCESS;
    }
  }
  else {
    LVar2 = lyplg_type_check_hints(hints,(char *)value,value_len,type->basetype,(int *)0x0,err);
    if (LVar2 != LY_SUCCESS) goto LAB_001bd873;
    if ((options & 8) == 0) {
      range = (lysc_range *)type[1].name;
      if (range != (lysc_range *)0x0) {
        sVar5 = ly_utf8len((char *)value,value_len);
        LVar2 = lyplg_type_validate_range(LY_TYPE_STRING,range,sVar5,(char *)value,value_len,err);
        if (LVar2 != LY_SUCCESS) goto LAB_001bd873;
      }
      LVar2 = lyplg_type_validate_patterns
                        ((lysc_pattern **)type[1].exts,(char *)value,value_len,err);
      if (LVar2 != LY_SUCCESS) goto LAB_001bd873;
    }
    str_p = (char **)((long)&storage->field_2 + 0x10);
    pcVar6 = ly_strnchr((char *)value,0x25,value_len);
    if (pcVar6 == (char *)0x0) {
      *str_p = (char *)0x0;
      sVar5 = value_len;
      if ((options & 1) == 0) goto LAB_001bd8de;
LAB_001bd8f5:
      local_50 = (char *)0x0;
      __cp = (char *)value;
LAB_001bd901:
      iVar3 = inet_pton(10,__cp,__buf);
      if (iVar3 == 0) {
        LVar2 = ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                           "Failed to convert IPv6 address \"%s\".",__cp);
      }
      else {
        LVar2 = LY_SUCCESS;
        if ((options & 1) != 0 && pcVar6 != (char *)0x0) {
          *pcVar6 = '%';
        }
      }
    }
    else {
      sVar5 = (long)pcVar6 - (long)value;
      LVar2 = lydict_insert(ctx,pcVar6 + 1,~sVar5 + value_len,str_p);
      if (LVar2 == LY_SUCCESS) {
        if ((options & 1) != 0) {
          *pcVar6 = '\0';
          goto LAB_001bd8f5;
        }
LAB_001bd8de:
        local_50 = strndup((char *)value,sVar5);
        __cp = local_50;
        goto LAB_001bd901;
      }
      local_50 = (char *)0x0;
    }
    free(local_50);
    if (format == LY_VALUE_CANON && LVar2 == LY_SUCCESS) {
      if ((options & 1) != 0) {
        LVar2 = lydict_insert_zc(ctx,(char *)value,&storage->_canonical);
        goto LAB_001bd882;
      }
      str_p_00 = storage;
      pcVar6 = "";
      if (value_len != 0) {
        pcVar6 = (char *)value;
      }
LAB_001bd996:
      LVar2 = lydict_insert(ctx,pcVar6,value_len,&str_p_00->_canonical);
    }
  }
LAB_001bd873:
  if ((options & 1) != 0) {
    free(value);
  }
LAB_001bd882:
  if (LVar2 != LY_SUCCESS) {
    lydict_remove(ctx,storage->_canonical);
    storage->_canonical = (char *)0x0;
    lydict_remove(ctx,*(char **)((long)&storage->field_2 + 0x10));
  }
  return LVar2;
}

Assistant:

static LY_ERR
lyplg_type_store_ipv6_address(const struct ly_ctx *ctx, const struct lysc_type *type, const void *value, size_t value_len,
        uint32_t options, LY_VALUE_FORMAT format, void *UNUSED(prefix_data), uint32_t hints,
        const struct lysc_node *UNUSED(ctx_node), struct lyd_value *storage, struct lys_glob_unres *UNUSED(unres),
        struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS;
    const char *value_str = value;
    struct lysc_type_str *type_str = (struct lysc_type_str *)type;
    struct lyd_value_ipv6_address *val;
    size_t i;

    /* init storage */
    memset(storage, 0, sizeof *storage);
    LYPLG_TYPE_VAL_INLINE_PREPARE(storage, val);
    LY_CHECK_ERR_GOTO(!val, ret = LY_EMEM, cleanup);
    storage->realtype = type;

    if (format == LY_VALUE_LYB) {
        /* validation */
        if (value_len < 16) {
            ret = ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid LYB ipv6-address value size %zu "
                    "(expected at least 16).", value_len);
            goto cleanup;
        }
        for (i = 16; i < value_len; ++i) {
            if (!isalnum(value_str[i])) {
                ret = ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid LYB ipv6-address zone character 0x%x.",
                        value_str[i]);
                goto cleanup;
            }
        }

        /* store IP address */
        memcpy(&val->addr, value, sizeof val->addr);

        /* store zone, if any */
        if (value_len > 16) {
            ret = lydict_insert(ctx, value_str + 16, value_len - 16, &val->zone);
            LY_CHECK_GOTO(ret, cleanup);
        } else {
            val->zone = NULL;
        }

        /* success */
        goto cleanup;
    }

    /* check hints */
    ret = lyplg_type_check_hints(hints, value, value_len, type->basetype, NULL, err);
    LY_CHECK_GOTO(ret, cleanup);

    if (!(options & LYPLG_TYPE_STORE_ONLY)) {
        /* length restriction of the string */
        if (type_str->length) {
            /* value_len is in bytes, but we need number of characters here */
            ret = lyplg_type_validate_range(LY_TYPE_STRING, type_str->length, ly_utf8len(value, value_len), value, value_len, err);
            LY_CHECK_GOTO(ret, cleanup);
        }

        /* pattern restrictions */
        ret = lyplg_type_validate_patterns(type_str->patterns, value, value_len, err);
        LY_CHECK_GOTO(ret, cleanup);
    }

    /* get the network-byte order address */
    ret = ipv6address_str2ip(value, value_len, options, ctx, &val->addr, &val->zone, err);
    LY_CHECK_GOTO(ret, cleanup);

    if (format == LY_VALUE_CANON) {
        /* store canonical value */
        if (options & LYPLG_TYPE_STORE_DYNAMIC) {
            ret = lydict_insert_zc(ctx, (char *)value, &storage->_canonical);
            options &= ~LYPLG_TYPE_STORE_DYNAMIC;
            LY_CHECK_GOTO(ret, cleanup);
        } else {
            ret = lydict_insert(ctx, value_len ? value : "", value_len, &storage->_canonical);
            LY_CHECK_GOTO(ret, cleanup);
        }
    }

cleanup:
    if (options & LYPLG_TYPE_STORE_DYNAMIC) {
        free((void *)value);
    }

    if (ret) {
        lyplg_type_free_ipv6_address(ctx, storage);
    }
    return ret;
}